

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::AJoint::Prepare(AJoint *this,btScalar dt,int iterations)

{
  btTransform *pbVar1;
  float *s;
  btMatrix3x3 *m;
  Body *in_RDI;
  float in_XMM0_Da;
  btVector3 bVar2;
  int in_stack_ffffffffffffff18;
  btScalar in_stack_ffffffffffffff1c;
  Joint *in_stack_ffffffffffffff20;
  btVector3 *in_stack_ffffffffffffff28;
  btCollisionObject **v;
  btMatrix3x3 *in_stack_ffffffffffffff30;
  float local_b8;
  btScalar local_b4;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Body *in_stack_ffffffffffffff78;
  float local_64;
  float local_60;
  float local_5c;
  btScalar local_58;
  btScalar local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  btRigidBody *local_30;
  btCollisionObject *pbStack_28;
  btCollisionObject *local_20;
  Cluster *pCStack_18;
  float local_c;
  
  local_c = in_XMM0_Da;
  (**(code **)(*(long *)&(in_RDI[9].m_soft)->m_masses + 0x10))();
  Joint::Prepare(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  pbVar1 = Body::xform(in_RDI);
  btTransform::getBasis(pbVar1);
  bVar2 = ::operator*(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pCStack_18 = bVar2.m_floats._8_8_;
  local_20 = bVar2.m_floats._0_8_;
  v = &in_RDI[7].m_collisionObject;
  in_RDI[7].m_collisionObject = local_20;
  in_RDI[8].m_soft = pCStack_18;
  pbVar1 = Body::xform(in_RDI);
  btTransform::getBasis(pbVar1);
  bVar2 = ::operator*(in_stack_ffffffffffffff30,(btVector3 *)v);
  pbStack_28 = bVar2.m_floats._8_8_;
  local_30 = bVar2.m_floats._0_8_;
  in_RDI[8].m_rigid = local_30;
  in_RDI[8].m_collisionObject = pbStack_28;
  bVar2 = btCross((btVector3 *)in_stack_ffffffffffffff20,
                  (btVector3 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_48 = bVar2.m_floats._8_8_;
  local_50 = bVar2.m_floats._0_8_;
  bVar2 = NormalizeAny((btVector3 *)in_stack_ffffffffffffff20);
  local_38 = bVar2.m_floats._8_8_;
  local_40 = bVar2.m_floats._0_8_;
  *(undefined8 *)((long)&in_RDI[4].m_soft + 4) = local_40;
  *(undefined8 *)((long)&in_RDI[4].m_rigid + 4) = local_38;
  local_58 = btDot((btVector3 *)in_stack_ffffffffffffff20,
                   (btVector3 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_5c = -1.0;
  local_60 = 1.0;
  Clamp<float>(&local_58,&local_5c,&local_60);
  local_54 = btAcos(0.0);
  s = btMin<float>(&Prepare::maxdrift,&local_54);
  btVector3::operator*=((btVector3 *)((long)&in_RDI[4].m_soft + 4),s);
  local_64 = *(float *)((long)&in_RDI[3].m_collisionObject + 4) / local_c;
  btVector3::operator*=((btVector3 *)((long)&in_RDI[4].m_soft + 4),&local_64);
  m = Body::invWorldInertia(in_stack_ffffffffffffff78);
  Body::invWorldInertia(in_stack_ffffffffffffff78);
  AngularImpulseMatrix
            ((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  btMatrix3x3::operator=
            ((btMatrix3x3 *)((long)&in_RDI[5].m_rigid + 4),(btMatrix3x3 *)&stack0xffffffffffffff6c);
  if (0.0 < *(float *)&in_RDI[4].m_soft) {
    in_stack_ffffffffffffff20 = (Joint *)((long)&in_RDI[5].m_rigid + 4);
    bVar2 = ::operator*(m->m_el,(btScalar *)v);
    local_b4 = bVar2.m_floats[0];
    bVar2 = ::operator*(m,(btVector3 *)v);
    *(long *)((long)&in_RDI[4].m_collisionObject + 4) = bVar2.m_floats._0_8_;
    *(long *)((long)&in_RDI[5].m_soft + 4) = bVar2.m_floats._8_8_;
    local_b8 = 1.0 - *(float *)&in_RDI[4].m_soft;
    btVector3::operator*=((btVector3 *)((long)&in_RDI[4].m_soft + 4),&local_b8);
  }
  btVector3::operator/=
            ((btVector3 *)in_stack_ffffffffffffff20,
             (btScalar *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  return;
}

Assistant:

void				btSoftBody::AJoint::Prepare(btScalar dt,int iterations)
{
	static const btScalar	maxdrift=SIMD_PI/16;
	m_icontrol->Prepare(this);
	Joint::Prepare(dt,iterations);
	m_axis[0]	=	m_bodies[0].xform().getBasis()*m_refs[0];
	m_axis[1]	=	m_bodies[1].xform().getBasis()*m_refs[1];
	m_drift		=	NormalizeAny(btCross(m_axis[1],m_axis[0]));
	m_drift		*=	btMin(maxdrift,btAcos(Clamp<btScalar>(btDot(m_axis[0],m_axis[1]),-1,+1)));
	m_drift		*=	m_erp/dt;
	m_massmatrix=	AngularImpulseMatrix(m_bodies[0].invWorldInertia(),m_bodies[1].invWorldInertia());
	if(m_split>0)
	{
		m_sdrift	=	m_massmatrix*(m_drift*m_split);
		m_drift		*=	1-m_split;
	}
	m_drift	/=(btScalar)iterations;
}